

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O1

void __thiscall Imf_2_5::DwaCompressor::~DwaCompressor(DwaCompressor *this)

{
  Zip *this_00;
  pointer pCVar1;
  long lVar2;
  
  (this->super_Compressor)._vptr_Compressor = (_func_int **)&PTR__DwaCompressor_0300ca80;
  if (this->_packedAcBuffer != (char *)0x0) {
    operator_delete__(this->_packedAcBuffer);
  }
  if (this->_packedDcBuffer != (char *)0x0) {
    operator_delete__(this->_packedDcBuffer);
  }
  if (this->_rleBuffer != (char *)0x0) {
    operator_delete__(this->_rleBuffer);
  }
  if (this->_outBuffer != (char *)0x0) {
    operator_delete__(this->_outBuffer);
  }
  this_00 = this->_zip;
  if (this_00 != (Zip *)0x0) {
    Zip::~Zip(this_00);
    operator_delete(this_00,0x10);
  }
  lVar2 = 0x1d;
  do {
    if (*(void **)(this->_min + lVar2 * 2 + -7) != (void *)0x0) {
      operator_delete__(*(void **)(this->_min + lVar2 * 2 + -7));
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x20);
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  ~vector(&this->_channelRules);
  pCVar1 = (this->_cscSets).
           super__Vector_base<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pCVar1 != (pointer)0x0) {
    operator_delete(pCVar1,(long)(this->_cscSets).
                                 super__Vector_base<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pCVar1);
  }
  std::
  vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
  ::~vector(&this->_channelData);
  std::
  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>_>
               *)&this->_channels);
  Compressor::~Compressor(&this->super_Compressor);
  return;
}

Assistant:

DwaCompressor::~DwaCompressor()
{
    delete[] _packedAcBuffer;
    delete[] _packedDcBuffer;
    delete[] _rleBuffer;
    delete[] _outBuffer;
    delete _zip;

    for (int i=0; i<NUM_COMPRESSOR_SCHEMES; ++i)
        delete[] _planarUncBuffer[i];
}